

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lua-mongo.c
# Opt level: O2

int op_reply(lua_State *L)

{
  int *p;
  int iVar1;
  int iVar2;
  int iVar3;
  char *pcVar4;
  ulong uVar5;
  int iVar6;
  long n;
  int *p_00;
  ulong uVar7;
  ulong n_00;
  size_t data_len;
  
  data_len = 0;
  iVar3 = 1;
  pcVar4 = luaL_checklstring(L,1,&data_len);
  if (data_len < 0x20) {
    lua_pushboolean(L,0);
  }
  else {
    n = (long)*(int *)(pcVar4 + 4);
    if ((pcVar4[0xc] & 2U) == 0) {
      iVar3 = *(int *)(pcVar4 + 0x18);
      iVar1 = *(int *)(pcVar4 + 0x1c);
      iVar6 = (int)data_len + -0x20;
      p = (int *)(pcVar4 + 0x20);
      iVar2 = lua_type(L,2);
      if (iVar2 == 5) {
        p_00 = p;
        uVar7 = 0;
        for (; n_00 = uVar7 + 1, 4 < iVar6; iVar6 = iVar6 - iVar2) {
          lua_pushlightuserdata(L,p_00);
          lua_rawseti(L,2,n_00);
          iVar2 = *p_00;
          p_00 = (int *)((long)p_00 + (long)iVar2);
          uVar7 = n_00;
        }
        if (iVar1 != (int)uVar7) {
          lua_pushboolean(L,0);
          lua_pushinteger(L,n);
          return 2;
        }
        uVar5 = lua_rawlen(L,2);
        if ((int)uVar5 < (int)uVar7) {
          uVar5 = uVar7;
        }
        for (; n_00 - (uVar5 & 0xffffffff) != 1; n_00 = n_00 + 1) {
          lua_pushnil(L);
          lua_rawseti(L,2,n_00);
        }
      }
      else if (3 < iVar6) {
        iVar6 = iVar6 - *p;
      }
      if (iVar6 == 0) {
        lua_pushboolean(L,1);
        lua_pushinteger(L,n);
        if (iVar1 == 0) {
          lua_pushnil(L);
        }
        else {
          lua_pushlightuserdata(L,p);
        }
        if ((*(int *)(pcVar4 + 0x10) == 0) && (*(int *)(pcVar4 + 0x14) == 0)) {
          lua_pushnil(L);
        }
        else {
          lua_pushlstring(L,pcVar4 + 0x10,8);
        }
        lua_pushinteger(L,(long)iVar3);
        iVar3 = 5;
      }
      else {
        iVar3 = luaL_error(L,"Invalid result bson document");
      }
    }
    else {
      lua_pushboolean(L,0);
      lua_pushinteger(L,n);
      lua_pushlightuserdata(L,pcVar4 + 0x20);
      iVar3 = 3;
    }
  }
  return iVar3;
}

Assistant:

static int
op_reply(lua_State *L) {
	size_t data_len = 0;
	const char * data = luaL_checklstring(L,1,&data_len);
	struct {
//		int32_t length; // total message size, including this
		int32_t request_id; // identifier for this message
		int32_t response_id; // requestID from the original request
							// (used in reponses from db)
		int32_t opcode; // request type 
		int32_t flags;
		int32_t cursor_id[2];
		int32_t starting;
		int32_t number;
	} const *reply = (const void *)data;

	if (data_len < sizeof(*reply)) {
		lua_pushboolean(L, 0);
		return 1;
	}

	int id = little_endian(reply->response_id);
	int flags = little_endian(reply->flags);
	if (flags & REPLY_QUERYFAILURE) {
		lua_pushboolean(L,0);
		lua_pushinteger(L, id);
		lua_pushlightuserdata(L, (void *)(reply+1));
		return 3;
	}

	int starting_from = little_endian(reply->starting);
	int number = little_endian(reply->number);
	int sz = (int)data_len - sizeof(*reply);
	const uint8_t * doc = (const uint8_t *)(reply+1);

	if (lua_istable(L,2)) {
		int i = 1;
		while (sz > 4) {
			lua_pushlightuserdata(L, (void *)doc);
			lua_rawseti(L, 2, i);

			int32_t doc_len = get_length((document)doc);

			doc += doc_len;
			sz -= doc_len;

			++i;
		}
		if (i != number + 1) {
			lua_pushboolean(L,0);
			lua_pushinteger(L, id);
			return 2;
		}
		int c = lua_rawlen(L, 2);
		for (;i<=c;i++) {
			lua_pushnil(L);
			lua_rawseti(L, 2, i);
		}
	} else {
		if (sz >= 4) {
			sz -= get_length((document)doc);
		}
	}
	if (sz != 0) {
		return luaL_error(L, "Invalid result bson document");
	}
	lua_pushboolean(L,1);
	lua_pushinteger(L, id);
	if (number == 0)
		lua_pushnil(L);
	else
		lua_pushlightuserdata(L, (void *)(reply+1));
	if (reply->cursor_id[0] == 0 && reply->cursor_id[1]==0) {
		// closed cursor
		lua_pushnil(L);
	} else {
		lua_pushlstring(L, (const char *)(reply->cursor_id), 8);
	}
	lua_pushinteger(L, starting_from);

	return 5;
}